

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

int32_t __thiscall icu_63::number::impl::SimpleModifier::getCodePointCount(SimpleModifier *this)

{
  int32_t iVar1;
  int local_14;
  int32_t count;
  SimpleModifier *this_local;
  
  local_14 = 0;
  if (0 < this->fPrefixLength) {
    local_14 = UnicodeString::countChar32(&this->fCompiledPattern,2,this->fPrefixLength);
  }
  if (0 < this->fSuffixLength) {
    iVar1 = UnicodeString::countChar32
                      (&this->fCompiledPattern,this->fSuffixOffset + 1,this->fSuffixLength);
    local_14 = iVar1 + local_14;
  }
  return local_14;
}

Assistant:

int32_t SimpleModifier::getCodePointCount() const {
    int32_t count = 0;
    if (fPrefixLength > 0) {
        count += fCompiledPattern.countChar32(2, fPrefixLength);
    }
    if (fSuffixLength > 0) {
        count += fCompiledPattern.countChar32(1 + fSuffixOffset, fSuffixLength);
    }
    return count;
}